

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86logging.cpp
# Opt level: O0

Error asmjit::X86Logging_formatImmText
                (StringBuilder *sb,uint32_t u8,uint32_t bits,uint32_t advance,char *text,
                uint32_t count)

{
  uint uVar1;
  Error EVar2;
  int in_ECX;
  byte in_DL;
  uint in_ESI;
  char *in_R8;
  uint in_R9D;
  Error _err_2;
  Error _err_1;
  uint32_t value;
  uint32_t i;
  uint32_t pos;
  uint32_t mask;
  Error _err;
  uint32_t i_1;
  undefined4 in_stack_ffffffffffffff60;
  char c;
  uint32_t in_stack_ffffffffffffff64;
  uint in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  uint uVar3;
  int iVar4;
  undefined4 uVar5;
  undefined4 in_stack_ffffffffffffff88;
  uint local_6c;
  Error local_5c;
  uint local_10;
  char *local_8;
  
  local_5c = StringBuilder::_opChar
                       ((StringBuilder *)
                        CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                        in_stack_ffffffffffffff64,(char)((uint)in_stack_ffffffffffffff60 >> 0x18));
  if (local_5c == 0) {
    uVar1 = (1 << (in_DL & 0x1f)) - 1;
    iVar4 = 0;
    uVar5 = 0;
    local_6c = in_ESI;
    for (uVar3 = 0; c = (char)((uint)in_stack_ffffffffffffff60 >> 0x18), uVar3 < in_R9D;
        uVar3 = uVar3 + 1) {
      in_stack_ffffffffffffff68 = (local_6c & uVar1) + iVar4;
      if (uVar3 != 0) {
        EVar2 = StringBuilder::_opChar
                          ((StringBuilder *)CONCAT44(uVar3,in_stack_ffffffffffffff68),
                           in_stack_ffffffffffffff64,c);
        if (EVar2 != 0) {
          return EVar2;
        }
        in_stack_ffffffffffffff64 = 0;
      }
      local_8 = in_R8;
      for (local_10 = 0; local_10 < in_stack_ffffffffffffff68; local_10 = local_10 + 1) {
        for (; *local_8 != '\0'; local_8 = local_8 + 1) {
        }
        local_8 = local_8 + 1;
      }
      EVar2 = StringBuilder::_opString
                        ((StringBuilder *)CONCAT44(in_ECX,in_stack_ffffffffffffff88),
                         (uint32_t)((ulong)in_R8 >> 0x20),(char *)CONCAT44(in_R9D,uVar5),
                         CONCAT44(uVar1,iVar4));
      if (EVar2 != 0) {
        return EVar2;
      }
      local_6c = local_6c >> (in_DL & 0x1f);
      iVar4 = in_ECX + iVar4;
      in_stack_ffffffffffffff60 = 0;
    }
    local_5c = StringBuilder::_opChar
                         ((StringBuilder *)CONCAT44(uVar3,in_stack_ffffffffffffff68),
                          in_stack_ffffffffffffff64,c);
  }
  return local_5c;
}

Assistant:

ASMJIT_FAVOR_SIZE static Error X86Logging_formatImmText(StringBuilder& sb, uint32_t u8, uint32_t bits, uint32_t advance, const char* text, uint32_t count = 1) noexcept {
  ASMJIT_PROPAGATE(sb.appendChar('<'));

  uint32_t mask = (1 << bits) - 1;
  uint32_t pos = 0;

  for (uint32_t i = 0; i < count; i++, u8 >>= bits, pos += advance) {
    uint32_t value = (u8 & mask) + pos;
    if (i != 0)
      ASMJIT_PROPAGATE(sb.appendChar('|'));
    ASMJIT_PROPAGATE(sb.appendString(Utils::findPackedString(text, value)));
  }

  return sb.appendChar('>');
}